

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::avx::
BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
::intersect(BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
            *this,Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  RayQueryContext *pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 (*pauVar35) [16];
  AABBNodeMB4D *node1;
  ulong uVar36;
  uint uVar37;
  undefined4 uVar38;
  RayQueryContext *pRVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  undefined1 (*pauVar45) [16];
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar56 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar106 [64];
  undefined1 auVar111 [16];
  uint uVar113;
  uint uVar114;
  uint uVar115;
  undefined1 auVar112 [64];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  float fVar119;
  float fVar125;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar123;
  float fVar124;
  undefined1 auVar122 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_11d8 [44];
  int local_11ac;
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  long local_1180;
  long local_1178;
  ulong local_1170;
  undefined1 (*local_1168) [16];
  RayHit *local_1160;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  int *local_1138;
  RayQueryContext *local_1130;
  undefined4 *local_1128;
  Intersectors *local_1120;
  undefined4 *local_1118;
  undefined4 local_1110;
  undefined4 local_1108;
  undefined4 local_1104;
  undefined4 local_1100;
  float local_10fc;
  float local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  undefined4 local_10ec;
  undefined4 local_10e8;
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1058 [16];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)(*(long *)this + 0x70) != 8) {
    local_1160 = ray;
    pauVar45 = (undefined1 (*) [16])local_f68;
    local_f78 = *(long *)(*(long *)this + 0x70);
    uStack_f70 = 0;
    auVar74 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(*(uint *)((long)&This->leafIntersector + 4)));
    uVar37 = *(uint *)&(This->intersector1).intersect;
    auVar73 = ZEXT464(uVar37);
    auVar86._8_4_ = 0x7fffffff;
    auVar86._0_8_ = 0x7fffffff7fffffff;
    auVar86._12_4_ = 0x7fffffff;
    auVar86 = vandps_avx((undefined1  [16])This->collider,auVar86);
    auVar95._8_4_ = 0x219392ef;
    auVar95._0_8_ = 0x219392ef219392ef;
    auVar95._12_4_ = 0x219392ef;
    auVar86 = vcmpps_avx(auVar86,auVar95,1);
    auVar86 = vblendvps_avx((undefined1  [16])This->collider,auVar95,auVar86);
    auVar95 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416(uVar37));
    auVar100 = vrcpps_avx(auVar86);
    fVar49 = auVar100._0_4_;
    auVar88._0_4_ = auVar86._0_4_ * fVar49;
    fVar57 = auVar100._4_4_;
    auVar88._4_4_ = auVar86._4_4_ * fVar57;
    fVar58 = auVar100._8_4_;
    auVar88._8_4_ = auVar86._8_4_ * fVar58;
    fVar59 = auVar100._12_4_;
    auVar88._12_4_ = auVar86._12_4_ * fVar59;
    auVar100._8_4_ = 0x3f800000;
    auVar100._0_8_ = 0x3f8000003f800000;
    auVar100._12_4_ = 0x3f800000;
    auVar86 = vsubps_avx(auVar100,auVar88);
    auVar89._0_4_ = fVar49 + fVar49 * auVar86._0_4_;
    auVar89._4_4_ = fVar57 + fVar57 * auVar86._4_4_;
    auVar89._8_4_ = fVar58 + fVar58 * auVar86._8_4_;
    auVar89._12_4_ = fVar59 + fVar59 * auVar86._12_4_;
    uVar38 = *(undefined4 *)&This->ptr;
    local_f88._4_4_ = uVar38;
    local_f88._0_4_ = uVar38;
    local_f88._8_4_ = uVar38;
    local_f88._12_4_ = uVar38;
    auVar103 = ZEXT1664(local_f88);
    uVar38 = *(undefined4 *)((long)&This->ptr + 4);
    local_f98._4_4_ = uVar38;
    local_f98._0_4_ = uVar38;
    local_f98._8_4_ = uVar38;
    local_f98._12_4_ = uVar38;
    auVar106 = ZEXT1664(local_f98);
    uVar38 = *(undefined4 *)&This->leafIntersector;
    local_fa8._4_4_ = uVar38;
    local_fa8._0_4_ = uVar38;
    local_fa8._8_4_ = uVar38;
    local_fa8._12_4_ = uVar38;
    auVar112 = ZEXT1664(local_fa8);
    local_fb8 = vshufps_avx(auVar89,auVar89,0);
    auVar117 = ZEXT1664(local_fb8);
    auVar86 = vmovshdup_avx(auVar89);
    local_fc8 = vshufps_avx(auVar89,auVar89,0x55);
    auVar118 = ZEXT1664(local_fc8);
    auVar100 = vshufpd_avx(auVar89,auVar89,1);
    uVar43 = (ulong)(auVar89._0_4_ < 0.0) << 4;
    uVar46 = (ulong)(auVar86._0_4_ < 0.0) << 4 | 0x20;
    local_fd8 = vshufps_avx(auVar89,auVar89,0xaa);
    auVar122 = ZEXT1664(local_fd8);
    uVar40 = (ulong)(auVar100._0_4_ < 0.0) << 4 | 0x40;
    uVar47 = uVar43 ^ 0x10;
    local_fe8 = vshufps_avx(auVar74,auVar74,0);
    auVar128 = ZEXT1664(local_fe8);
    auVar86 = vshufps_avx(auVar95,auVar95,0);
    auVar56 = ZEXT1664(auVar86);
    local_10b8 = mm_lookupmask_ps._240_8_;
    uStack_10b0 = mm_lookupmask_ps._248_8_;
LAB_00b6a5e1:
    if (pauVar45 != (undefined1 (*) [16])&local_f78) {
      pauVar35 = pauVar45 + -1;
      pauVar45 = pauVar45 + -1;
      if (*(float *)(*pauVar35 + 8) <= auVar73._0_4_) {
        uVar48 = *(ulong *)*pauVar45;
        while ((uVar48 & 8) == 0) {
          uVar36 = uVar48 & 0xfffffffffffffff0;
          fVar49 = *(float *)((long)&(This->collider).name + 4);
          auVar60._4_4_ = fVar49;
          auVar60._0_4_ = fVar49;
          auVar60._8_4_ = fVar49;
          auVar60._12_4_ = fVar49;
          pfVar2 = (float *)(uVar36 + 0x80 + uVar43);
          pfVar1 = (float *)(uVar36 + 0x20 + uVar43);
          auVar74._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar74._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar74._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar74._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          auVar86 = vsubps_avx(auVar74,auVar103._0_16_);
          auVar75._0_4_ = auVar117._0_4_ * auVar86._0_4_;
          auVar75._4_4_ = auVar117._4_4_ * auVar86._4_4_;
          auVar75._8_4_ = auVar117._8_4_ * auVar86._8_4_;
          auVar75._12_4_ = auVar117._12_4_ * auVar86._12_4_;
          pfVar2 = (float *)(uVar36 + 0x80 + uVar46);
          auVar86 = vmaxps_avx(auVar128._0_16_,auVar75);
          pfVar1 = (float *)(uVar36 + 0x20 + uVar46);
          auVar83._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar83._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar83._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar83._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          auVar74 = vsubps_avx(auVar83,auVar106._0_16_);
          pfVar2 = (float *)(uVar36 + 0x80 + uVar40);
          pfVar1 = (float *)(uVar36 + 0x20 + uVar40);
          auVar90._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar90._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar90._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar90._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          auVar84._0_4_ = auVar118._0_4_ * auVar74._0_4_;
          auVar84._4_4_ = auVar118._4_4_ * auVar74._4_4_;
          auVar84._8_4_ = auVar118._8_4_ * auVar74._8_4_;
          auVar84._12_4_ = auVar118._12_4_ * auVar74._12_4_;
          auVar74 = vsubps_avx(auVar90,auVar112._0_16_);
          auVar91._0_4_ = auVar122._0_4_ * auVar74._0_4_;
          auVar91._4_4_ = auVar122._4_4_ * auVar74._4_4_;
          auVar91._8_4_ = auVar122._8_4_ * auVar74._8_4_;
          auVar91._12_4_ = auVar122._12_4_ * auVar74._12_4_;
          auVar74 = vmaxps_avx(auVar84,auVar91);
          pfVar2 = (float *)(uVar36 + 0x80 + uVar47);
          pfVar1 = (float *)(uVar36 + 0x20 + uVar47);
          auVar92._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar92._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar92._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar92._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          local_10a8 = vmaxps_avx(auVar86,auVar74);
          auVar86 = vsubps_avx(auVar92,auVar103._0_16_);
          auVar85._0_4_ = auVar117._0_4_ * auVar86._0_4_;
          auVar85._4_4_ = auVar117._4_4_ * auVar86._4_4_;
          auVar85._8_4_ = auVar117._8_4_ * auVar86._8_4_;
          auVar85._12_4_ = auVar117._12_4_ * auVar86._12_4_;
          auVar86 = vminps_avx(auVar56._0_16_,auVar85);
          pfVar2 = (float *)(uVar36 + 0x80 + (uVar46 ^ 0x10));
          pfVar1 = (float *)(uVar36 + 0x20 + (uVar46 ^ 0x10));
          auVar93._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar93._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar93._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar93._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          auVar74 = vsubps_avx(auVar93,auVar106._0_16_);
          auVar94._0_4_ = auVar118._0_4_ * auVar74._0_4_;
          auVar94._4_4_ = auVar118._4_4_ * auVar74._4_4_;
          auVar94._8_4_ = auVar118._8_4_ * auVar74._8_4_;
          auVar94._12_4_ = auVar118._12_4_ * auVar74._12_4_;
          pfVar2 = (float *)(uVar36 + 0x80 + (uVar40 ^ 0x10));
          pfVar1 = (float *)(uVar36 + 0x20 + (uVar40 ^ 0x10));
          auVar96._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar96._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar96._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar96._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          auVar74 = vsubps_avx(auVar96,auVar112._0_16_);
          auVar97._0_4_ = auVar122._0_4_ * auVar74._0_4_;
          auVar97._4_4_ = auVar122._4_4_ * auVar74._4_4_;
          auVar97._8_4_ = auVar122._8_4_ * auVar74._8_4_;
          auVar97._12_4_ = auVar122._12_4_ * auVar74._12_4_;
          auVar74 = vminps_avx(auVar94,auVar97);
          auVar86 = vminps_avx(auVar86,auVar74);
          auVar86 = vcmpps_avx(local_10a8,auVar86,2);
          if (((uint)uVar48 & 7) == 6) {
            auVar74 = vcmpps_avx(*(undefined1 (*) [16])(uVar36 + 0xe0),auVar60,2);
            auVar95 = vcmpps_avx(auVar60,*(undefined1 (*) [16])(uVar36 + 0xf0),1);
            auVar74 = vandps_avx(auVar74,auVar95);
            auVar86 = vandps_avx(auVar74,auVar86);
          }
          auVar86 = vpslld_avx(auVar86,0x1f);
          uVar37 = vmovmskps_avx(auVar86);
          context = (RayQueryContext *)CONCAT44((int)((ulong)context >> 0x20),uVar37);
          if (uVar37 == 0) {
            auVar86 = vmovshdup_avx(*(undefined1 (*) [16])((long)&(This->collider).name + 4));
            auVar73 = ZEXT1664(auVar86);
            goto LAB_00b6a5e1;
          }
          context = (RayQueryContext *)0x0;
          if ((byte)uVar37 != 0) {
            for (; ((byte)uVar37 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar48 = *(ulong *)(uVar36 + (long)context * 8);
          uVar37 = (uVar37 & 0xff) - 1 & uVar37 & 0xff;
          if (uVar37 != 0) {
            uVar113 = *(uint *)(local_10a8 + (long)context * 4);
            lVar42 = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
              }
            }
            uVar5 = *(ulong *)(uVar36 + lVar42 * 8);
            uVar114 = *(uint *)(local_10a8 + lVar42 * 4);
            uVar37 = uVar37 - 1 & uVar37;
            context = (RayQueryContext *)(ulong)uVar37;
            if (uVar37 == 0) {
              if (uVar113 < uVar114) {
                *(ulong *)*pauVar45 = uVar5;
                *(uint *)(*pauVar45 + 8) = uVar114;
                pauVar45 = pauVar45 + 1;
              }
              else {
                *(ulong *)*pauVar45 = uVar48;
                *(uint *)(*pauVar45 + 8) = uVar113;
                pauVar45 = pauVar45 + 1;
                uVar48 = uVar5;
              }
            }
            else {
              auVar61._8_8_ = 0;
              auVar61._0_8_ = uVar48;
              auVar86 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar113));
              auVar76._8_8_ = 0;
              auVar76._0_8_ = uVar5;
              auVar74 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar114));
              lVar42 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar37 >> lVar42 & 1) == 0; lVar42 = lVar42 + 1) {
                }
              }
              auVar87._8_8_ = 0;
              auVar87._0_8_ = *(ulong *)(uVar36 + lVar42 * 8);
              auVar100 = vpunpcklqdq_avx(auVar87,ZEXT416(*(uint *)(local_10a8 + lVar42 * 4)));
              auVar95 = vpcmpgtd_avx(auVar74,auVar86);
              uVar37 = uVar37 - 1 & uVar37;
              if (uVar37 == 0) {
                auVar88 = vpshufd_avx(auVar95,0xaa);
                auVar95 = vblendvps_avx(auVar74,auVar86,auVar88);
                auVar86 = vblendvps_avx(auVar86,auVar74,auVar88);
                auVar74 = vpcmpgtd_avx(auVar100,auVar95);
                auVar88 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar100,auVar95,auVar88);
                auVar95 = vblendvps_avx(auVar95,auVar100,auVar88);
                auVar100 = vpcmpgtd_avx(auVar95,auVar86);
                auVar88 = vpshufd_avx(auVar100,0xaa);
                auVar100 = vblendvps_avx(auVar95,auVar86,auVar88);
                auVar86 = vblendvps_avx(auVar86,auVar95,auVar88);
                *pauVar45 = auVar86;
                pauVar45[1] = auVar100;
                uVar48 = auVar74._0_8_;
                pauVar45 = pauVar45 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar37 != 0) {
                  for (; (uVar37 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar98._8_8_ = 0;
                auVar98._0_8_ = *(ulong *)(uVar36 + (long)context * 8);
                auVar89 = vpunpcklqdq_avx(auVar98,ZEXT416(*(uint *)(local_10a8 + (long)context * 4))
                                         );
                auVar88 = vpshufd_avx(auVar95,0xaa);
                auVar95 = vblendvps_avx(auVar74,auVar86,auVar88);
                auVar86 = vblendvps_avx(auVar86,auVar74,auVar88);
                auVar74 = vpcmpgtd_avx(auVar89,auVar100);
                auVar88 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar89,auVar100,auVar88);
                auVar100 = vblendvps_avx(auVar100,auVar89,auVar88);
                auVar88 = vpcmpgtd_avx(auVar100,auVar86);
                auVar89 = vpshufd_avx(auVar88,0xaa);
                auVar88 = vblendvps_avx(auVar100,auVar86,auVar89);
                auVar86 = vblendvps_avx(auVar86,auVar100,auVar89);
                auVar100 = vpcmpgtd_avx(auVar74,auVar95);
                auVar89 = vpshufd_avx(auVar100,0xaa);
                auVar100 = vblendvps_avx(auVar74,auVar95,auVar89);
                auVar74 = vblendvps_avx(auVar95,auVar74,auVar89);
                auVar95 = vpcmpgtd_avx(auVar88,auVar74);
                auVar89 = vpshufd_avx(auVar95,0xaa);
                auVar95 = vblendvps_avx(auVar88,auVar74,auVar89);
                auVar74 = vblendvps_avx(auVar74,auVar88,auVar89);
                *pauVar45 = auVar86;
                pauVar45[1] = auVar74;
                pauVar45[2] = auVar95;
                uVar48 = auVar100._0_8_;
                pauVar45 = pauVar45 + 3;
              }
            }
          }
        }
        lVar42 = (ulong)((uint)uVar48 & 0xf) - 8;
        uVar48 = uVar48 & 0xfffffffffffffff0;
        for (lVar44 = 0; lVar44 != lVar42; lVar44 = lVar44 + 1) {
          lVar41 = lVar44 * 0x140;
          fVar49 = *(float *)((long)&(This->collider).name + 4);
          pfVar2 = (float *)(uVar48 + 0x90 + lVar41);
          pfVar1 = (float *)(uVar48 + lVar41);
          auVar99._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar99._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar99._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar99._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0xa0 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x10 + lVar41);
          auVar101._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar101._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar101._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar101._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0xb0 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x20 + lVar41);
          auVar102._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar102._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar102._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar102._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0xc0 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x30 + lVar41);
          auVar62._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar62._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar62._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar62._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0xd0 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x40 + lVar41);
          auVar77._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar77._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar77._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar77._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0xe0 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x50 + lVar41);
          auVar105._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar105._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar105._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar105._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0xf0 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x60 + lVar41);
          auVar111._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar111._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar111._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar111._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar2 = (float *)(uVar48 + 0x100 + lVar41);
          pfVar1 = (float *)(uVar48 + 0x70 + lVar41);
          auVar116._0_4_ = fVar49 * *pfVar2 + *pfVar1;
          auVar116._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
          auVar116._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
          auVar116._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
          pfVar1 = (float *)(uVar48 + 0x110 + lVar41);
          pfVar2 = (float *)(uVar48 + 0x80 + lVar41);
          auVar50._0_4_ = fVar49 * *pfVar1 + *pfVar2;
          auVar50._4_4_ = fVar49 * pfVar1[1] + pfVar2[1];
          auVar50._8_4_ = fVar49 * pfVar1[2] + pfVar2[2];
          auVar50._12_4_ = fVar49 * pfVar1[3] + pfVar2[3];
          auVar95 = vsubps_avx(auVar99,auVar62);
          local_11a8 = vsubps_avx(auVar101,auVar77);
          auVar86 = vsubps_avx(auVar102,auVar105);
          auVar74 = vsubps_avx(auVar111,auVar99);
          auVar100 = vsubps_avx(auVar116,auVar101);
          auVar88 = vsubps_avx(auVar50,auVar102);
          fVar59 = auVar88._0_4_;
          fVar119 = local_11a8._0_4_;
          auVar51._0_4_ = fVar119 * fVar59;
          fVar12 = auVar88._4_4_;
          fVar123 = local_11a8._4_4_;
          auVar51._4_4_ = fVar123 * fVar12;
          fVar19 = auVar88._8_4_;
          fVar124 = local_11a8._8_4_;
          auVar51._8_4_ = fVar124 * fVar19;
          fVar26 = auVar88._12_4_;
          fVar125 = local_11a8._12_4_;
          auVar51._12_4_ = fVar125 * fVar26;
          fVar110 = auVar100._0_4_;
          fVar104 = auVar86._0_4_;
          auVar63._0_4_ = fVar104 * fVar110;
          fVar13 = auVar100._4_4_;
          fVar107 = auVar86._4_4_;
          auVar63._4_4_ = fVar107 * fVar13;
          fVar20 = auVar100._8_4_;
          fVar108 = auVar86._8_4_;
          auVar63._8_4_ = fVar108 * fVar20;
          fVar27 = auVar100._12_4_;
          fVar109 = auVar86._12_4_;
          auVar63._12_4_ = fVar109 * fVar27;
          local_1018 = vsubps_avx(auVar63,auVar51);
          fVar7 = auVar74._0_4_;
          auVar64._0_4_ = fVar104 * fVar7;
          fVar14 = auVar74._4_4_;
          auVar64._4_4_ = fVar107 * fVar14;
          fVar21 = auVar74._8_4_;
          auVar64._8_4_ = fVar108 * fVar21;
          fVar28 = auVar74._12_4_;
          auVar64._12_4_ = fVar109 * fVar28;
          fVar8 = auVar95._0_4_;
          auVar78._0_4_ = fVar59 * fVar8;
          fVar15 = auVar95._4_4_;
          auVar78._4_4_ = fVar12 * fVar15;
          fVar22 = auVar95._8_4_;
          auVar78._8_4_ = fVar19 * fVar22;
          fVar29 = auVar95._12_4_;
          auVar78._12_4_ = fVar26 * fVar29;
          local_1008 = vsubps_avx(auVar78,auVar64);
          auVar79._0_4_ = fVar110 * fVar8;
          auVar79._4_4_ = fVar13 * fVar15;
          auVar79._8_4_ = fVar20 * fVar22;
          auVar79._12_4_ = fVar27 * fVar29;
          auVar120._0_4_ = fVar119 * fVar7;
          auVar120._4_4_ = fVar123 * fVar14;
          auVar120._8_4_ = fVar124 * fVar21;
          auVar120._12_4_ = fVar125 * fVar28;
          local_1148 = vsubps_avx(auVar120,auVar79);
          uVar38 = *(undefined4 *)&This->ptr;
          auVar121._4_4_ = uVar38;
          auVar121._0_4_ = uVar38;
          auVar121._8_4_ = uVar38;
          auVar121._12_4_ = uVar38;
          uVar38 = *(undefined4 *)((long)&This->ptr + 4);
          auVar126._4_4_ = uVar38;
          auVar126._0_4_ = uVar38;
          auVar126._8_4_ = uVar38;
          auVar126._12_4_ = uVar38;
          uVar38 = *(undefined4 *)&This->leafIntersector;
          auVar129._4_4_ = uVar38;
          auVar129._0_4_ = uVar38;
          auVar129._8_4_ = uVar38;
          auVar129._12_4_ = uVar38;
          fVar49 = *(float *)((long)&(This->collider).collide + 4);
          local_1158 = vsubps_avx(auVar99,auVar121);
          fVar57 = *(float *)&(This->collider).name;
          auVar86 = vsubps_avx(auVar101,auVar126);
          auVar74 = vsubps_avx(auVar102,auVar129);
          fVar9 = auVar74._0_4_;
          auVar127._0_4_ = fVar49 * fVar9;
          fVar16 = auVar74._4_4_;
          auVar127._4_4_ = fVar49 * fVar16;
          fVar23 = auVar74._8_4_;
          auVar127._8_4_ = fVar49 * fVar23;
          fVar30 = auVar74._12_4_;
          auVar127._12_4_ = fVar49 * fVar30;
          fVar10 = auVar86._0_4_;
          auVar130._0_4_ = fVar57 * fVar10;
          fVar17 = auVar86._4_4_;
          auVar130._4_4_ = fVar57 * fVar17;
          fVar24 = auVar86._8_4_;
          auVar130._8_4_ = fVar57 * fVar24;
          fVar31 = auVar86._12_4_;
          auVar130._12_4_ = fVar57 * fVar31;
          auVar74 = vsubps_avx(auVar130,auVar127);
          fVar58 = *(float *)&(This->collider).collide;
          fVar11 = local_1158._0_4_;
          auVar52._0_4_ = fVar57 * fVar11;
          fVar18 = local_1158._4_4_;
          auVar52._4_4_ = fVar57 * fVar18;
          fVar25 = local_1158._8_4_;
          auVar52._8_4_ = fVar57 * fVar25;
          fVar32 = local_1158._12_4_;
          auVar52._12_4_ = fVar57 * fVar32;
          auVar65._0_4_ = fVar58 * fVar9;
          auVar65._4_4_ = fVar58 * fVar16;
          auVar65._8_4_ = fVar58 * fVar23;
          auVar65._12_4_ = fVar58 * fVar30;
          auVar100 = vsubps_avx(auVar65,auVar52);
          auVar66._0_4_ = fVar58 * fVar10;
          auVar66._4_4_ = fVar58 * fVar17;
          auVar66._8_4_ = fVar58 * fVar24;
          auVar66._12_4_ = fVar58 * fVar31;
          auVar80._0_4_ = fVar49 * fVar11;
          auVar80._4_4_ = fVar49 * fVar18;
          auVar80._8_4_ = fVar49 * fVar25;
          auVar80._12_4_ = fVar49 * fVar32;
          auVar88 = vsubps_avx(auVar80,auVar66);
          auVar81._0_4_ =
               fVar58 * local_1018._0_4_ + fVar49 * local_1008._0_4_ + fVar57 * local_1148._0_4_;
          auVar81._4_4_ =
               fVar58 * local_1018._4_4_ + fVar49 * local_1008._4_4_ + fVar57 * local_1148._4_4_;
          auVar81._8_4_ =
               fVar58 * local_1018._8_4_ + fVar49 * local_1008._8_4_ + fVar57 * local_1148._8_4_;
          auVar81._12_4_ =
               fVar58 * local_1018._12_4_ + fVar49 * local_1008._12_4_ + fVar57 * local_1148._12_4_;
          auVar67._8_8_ = 0x8000000080000000;
          auVar67._0_8_ = 0x8000000080000000;
          auVar86 = vandps_avx(auVar81,auVar67);
          uVar37 = auVar86._0_4_;
          local_10a8._0_4_ =
               (float)(uVar37 ^ (uint)(fVar7 * auVar74._0_4_ +
                                      fVar110 * auVar100._0_4_ + fVar59 * auVar88._0_4_));
          uVar113 = auVar86._4_4_;
          local_10a8._4_4_ =
               (float)(uVar113 ^
                      (uint)(fVar14 * auVar74._4_4_ +
                            fVar13 * auVar100._4_4_ + fVar12 * auVar88._4_4_));
          uVar114 = auVar86._8_4_;
          local_10a8._8_4_ =
               (float)(uVar114 ^
                      (uint)(fVar21 * auVar74._8_4_ +
                            fVar20 * auVar100._8_4_ + fVar19 * auVar88._8_4_));
          uVar115 = auVar86._12_4_;
          local_10a8._12_4_ =
               (float)(uVar115 ^
                      (uint)(fVar28 * auVar74._12_4_ +
                            fVar27 * auVar100._12_4_ + fVar26 * auVar88._12_4_));
          local_1098._0_4_ =
               (float)(uVar37 ^ (uint)(auVar74._0_4_ * fVar8 +
                                      auVar100._0_4_ * fVar119 + fVar104 * auVar88._0_4_));
          local_1098._4_4_ =
               (float)(uVar113 ^
                      (uint)(auVar74._4_4_ * fVar15 +
                            auVar100._4_4_ * fVar123 + fVar107 * auVar88._4_4_));
          local_1098._8_4_ =
               (float)(uVar114 ^
                      (uint)(auVar74._8_4_ * fVar22 +
                            auVar100._8_4_ * fVar124 + fVar108 * auVar88._8_4_));
          local_1098._12_4_ =
               (float)(uVar115 ^
                      (uint)(auVar74._12_4_ * fVar29 +
                            auVar100._12_4_ * fVar125 + fVar109 * auVar88._12_4_));
          auVar100 = ZEXT416(0) << 0x20;
          auVar86 = vcmpps_avx(local_10a8,auVar100,5);
          auVar74 = vcmpps_avx(local_1098,auVar100,5);
          auVar86 = vandps_avx(auVar86,auVar74);
          auVar68._8_4_ = 0x7fffffff;
          auVar68._0_8_ = 0x7fffffff7fffffff;
          auVar68._12_4_ = 0x7fffffff;
          local_1078 = vandps_avx(auVar81,auVar68);
          auVar74 = vcmpps_avx(auVar100,auVar81,4);
          auVar86 = vandps_avx(auVar86,auVar74);
          auVar69._0_4_ = local_10a8._0_4_ + local_1098._0_4_;
          auVar69._4_4_ = local_10a8._4_4_ + local_1098._4_4_;
          auVar69._8_4_ = local_10a8._8_4_ + local_1098._8_4_;
          auVar69._12_4_ = local_10a8._12_4_ + local_1098._12_4_;
          auVar74 = vcmpps_avx(auVar69,local_1078,2);
          auVar86 = vandps_avx(auVar86,auVar74);
          auVar33._8_8_ = uStack_10b0;
          auVar33._0_8_ = local_10b8;
          auVar33 = auVar33 & auVar86;
          if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar33[0xf] < '\0') {
            auVar34._8_8_ = uStack_10b0;
            auVar34._0_8_ = local_10b8;
            auVar86 = vandps_avx(auVar86,auVar34);
            local_1088._0_4_ =
                 (float)(uVar37 ^ (uint)(local_1018._0_4_ * fVar11 +
                                        local_1008._0_4_ * fVar10 + fVar9 * local_1148._0_4_));
            local_1088._4_4_ =
                 (float)(uVar113 ^
                        (uint)(local_1018._4_4_ * fVar18 +
                              local_1008._4_4_ * fVar17 + fVar16 * local_1148._4_4_));
            local_1088._8_4_ =
                 (float)(uVar114 ^
                        (uint)(local_1018._8_4_ * fVar25 +
                              local_1008._8_4_ * fVar24 + fVar23 * local_1148._8_4_));
            local_1088._12_4_ =
                 (float)(uVar115 ^
                        (uint)(local_1018._12_4_ * fVar32 +
                              local_1008._12_4_ * fVar31 + fVar30 * local_1148._12_4_));
            fVar49 = *(float *)((long)&This->leafIntersector + 4);
            fVar57 = local_1078._0_4_;
            auVar53._0_4_ = fVar57 * fVar49;
            fVar58 = local_1078._4_4_;
            auVar53._4_4_ = fVar58 * fVar49;
            fVar59 = local_1078._8_4_;
            auVar53._8_4_ = fVar59 * fVar49;
            fVar110 = local_1078._12_4_;
            auVar53._12_4_ = fVar110 * fVar49;
            auVar74 = vcmpps_avx(auVar53,local_1088,1);
            fVar49 = *(float *)&(This->intersector1).intersect;
            auVar70._0_4_ = fVar57 * fVar49;
            auVar70._4_4_ = fVar58 * fVar49;
            auVar70._8_4_ = fVar59 * fVar49;
            auVar70._12_4_ = fVar110 * fVar49;
            auVar100 = vcmpps_avx(local_1088,auVar70,2);
            auVar74 = vandps_avx(auVar100,auVar74);
            auVar100 = auVar86 & auVar74;
            if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar100[0xf] < '\0') {
              auVar3._0_8_ = (This->intersector1).intersect;
              auVar3._8_8_ = (This->intersector1).occluded;
              auVar73 = ZEXT1664(auVar3);
              auVar86 = vandps_avx(auVar86,auVar74);
              local_1058 = auVar86;
              local_ff8 = local_1148._0_8_;
              uStack_ff0 = local_1148._8_8_;
              local_1148._0_8_ = *(undefined8 *)&(local_1160->super_RayK<1>).org.field_0;
              local_1198 = auVar86;
              auVar74 = vrcpps_avx(local_1078);
              fVar49 = auVar74._0_4_;
              auVar71._0_4_ = fVar57 * fVar49;
              fVar57 = auVar74._4_4_;
              auVar71._4_4_ = fVar58 * fVar57;
              fVar58 = auVar74._8_4_;
              auVar71._8_4_ = fVar59 * fVar58;
              fVar59 = auVar74._12_4_;
              auVar71._12_4_ = fVar110 * fVar59;
              auVar82._8_4_ = 0x3f800000;
              auVar82._0_8_ = 0x3f8000003f800000;
              auVar82._12_4_ = 0x3f800000;
              auVar74 = vsubps_avx(auVar82,auVar71);
              fVar49 = fVar49 + fVar49 * auVar74._0_4_;
              fVar57 = fVar57 + fVar57 * auVar74._4_4_;
              fVar58 = fVar58 + fVar58 * auVar74._8_4_;
              fVar59 = fVar59 + fVar59 * auVar74._12_4_;
              local_1028._0_4_ = fVar49 * local_1088._0_4_;
              local_1028._4_4_ = fVar57 * local_1088._4_4_;
              local_1028._8_4_ = fVar58 * local_1088._8_4_;
              local_1028._12_4_ = fVar59 * local_1088._12_4_;
              auVar56 = ZEXT1664(local_1028);
              local_1048[0] = fVar49 * local_10a8._0_4_;
              local_1048[1] = fVar57 * local_10a8._4_4_;
              local_1048[2] = fVar58 * local_10a8._8_4_;
              local_1048[3] = fVar59 * local_10a8._12_4_;
              local_1038[0] = fVar49 * local_1098._0_4_;
              local_1038[1] = fVar57 * local_1098._4_4_;
              local_1038[2] = fVar58 * local_1098._8_4_;
              local_1038[3] = fVar59 * local_1098._12_4_;
              auVar54._8_4_ = 0x7f800000;
              auVar54._0_8_ = 0x7f8000007f800000;
              auVar54._12_4_ = 0x7f800000;
              auVar74 = vblendvps_avx(auVar54,local_1028,auVar86);
              auVar100 = vshufps_avx(auVar74,auVar74,0xb1);
              auVar100 = vminps_avx(auVar100,auVar74);
              auVar88 = vshufpd_avx(auVar100,auVar100,1);
              auVar100 = vminps_avx(auVar88,auVar100);
              auVar74 = vcmpps_avx(auVar74,auVar100,0);
              auVar100 = auVar86 & auVar74;
              if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar100[0xf] < '\0') {
                auVar86 = vandps_avx(auVar74,auVar86);
              }
              local_11d8._0_4_ = vextractps_avx(auVar3,1);
              local_11d8._4_12_ = auVar95._4_12_;
              uVar38 = vmovmskps_avx(auVar86);
              uVar36 = CONCAT44((int)((ulong)context >> 0x20),uVar38);
              context = (RayQueryContext *)0x0;
              if (uVar36 != 0) {
                for (; (uVar36 >> (long)context & 1) == 0;
                    context = (RayQueryContext *)((long)&context->scene + 1)) {
                }
              }
              local_11a8._0_8_ = lVar41 + uVar48;
              lVar41 = lVar41 + uVar48;
              do {
                local_10f0 = *(uint *)(lVar41 + 0x120 + (long)context * 4);
                pRVar6 = *(RayQueryContext **)
                          (*(long *)(local_1148._0_8_ + 0x1e8) + (ulong)local_10f0 * 8);
                if ((*(uint *)((long)&pRVar6[2].scene + 4) & local_11d8._0_4_) == 0) {
                  *(undefined4 *)(local_1198 + (long)context * 4) = 0;
                  uVar37 = local_11d8._0_4_;
                }
                else {
                  local_11d8._0_8_ = context;
                  lVar41 = *(long *)&(local_1160->super_RayK<1>).dir.field_0;
                  local_1158._0_8_ = lVar41;
                  local_10d8 = auVar73._0_16_;
                  local_10c8 = auVar56._0_16_;
                  if (*(long *)(lVar41 + 0x10) == 0) {
                    local_1128 = *(undefined4 **)
                                  ((long)&(local_1160->super_RayK<1>).org.field_0 + 8);
                    if (pRVar6[2].args == (RTCIntersectArguments *)0x0) {
                      fVar49 = local_1048[(long)context];
                      fVar57 = local_1038[(long)context];
                      *(undefined4 *)&(This->intersector1).intersect =
                           *(undefined4 *)(local_1028 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).pointQuery =
                           *(undefined4 *)(local_1018 + (long)context * 4);
                      *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) =
                           *(undefined4 *)(local_1008 + (long)context * 4);
                      *(undefined4 *)&(This->intersector1).name =
                           *(undefined4 *)((long)&local_ff8 + (long)context * 4);
                      *(float *)((long)&(This->intersector1).name + 4) = fVar49;
                      *(float *)&(This->intersector4).intersect = fVar57;
                      *(undefined4 *)((long)&(This->intersector4).intersect + 4) =
                           *(undefined4 *)(local_11a8._0_8_ + 0x130 + (long)context * 4);
                      *(uint *)&(This->intersector4).occluded = local_10f0;
                      context = (RayQueryContext *)0x0;
                      *(undefined4 *)((long)&(This->intersector4).occluded + 4) = *local_1128;
                      *(undefined4 *)&(This->intersector4).name = local_1128[1];
                      break;
                    }
                    local_1180 = lVar44;
                    local_1178 = lVar42;
                    local_1170 = uVar43;
                    local_1168 = pauVar45;
                  }
                  else {
                    local_1180 = lVar44;
                    local_1178 = lVar42;
                    local_1170 = uVar43;
                    local_1168 = pauVar45;
                    local_1128 = *(undefined4 **)
                                  ((long)&(local_1160->super_RayK<1>).org.field_0 + 8);
                  }
                  local_1108 = *(undefined4 *)(local_1018 + (long)context * 4);
                  local_1104 = *(undefined4 *)(local_1008 + (long)context * 4);
                  local_1100 = *(undefined4 *)((long)&local_ff8 + (long)context * 4);
                  local_10fc = local_1048[(long)context];
                  local_10f8 = local_1038[(long)context];
                  local_10f4 = *(undefined4 *)(local_11a8._0_8_ + 0x130 + (long)context * 4);
                  local_10ec = *local_1128;
                  local_10e8 = local_1128[1];
                  *(undefined4 *)&(This->intersector1).intersect =
                       *(undefined4 *)(local_1028 + (long)context * 4);
                  local_11ac = -1;
                  local_1138 = &local_11ac;
                  pRVar39 = (RayQueryContext *)pRVar6[1].scene;
                  local_1130 = pRVar39;
                  local_1120 = This;
                  local_1118 = &local_1108;
                  local_1110 = 1;
                  local_1180 = lVar44;
                  local_1178 = lVar42;
                  local_1170 = uVar43;
                  local_1168 = pauVar45;
                  if ((pRVar6[2].args == (RTCIntersectArguments *)0x0) ||
                     ((*(code *)pRVar6[2].args)(&local_1138), *local_1138 != 0)) {
                    if ((*(RTCIntersectArguments **)(local_1158._0_8_ + 0x10) !=
                         (RTCIntersectArguments *)0x0) &&
                       (((pRVar39 = (RayQueryContext *)local_1158._0_8_,
                         ((ulong)*(Scene **)local_1158._0_8_ & 2) != 0 ||
                         (pRVar39 = pRVar6, ((ulong)pRVar6[2].user & 0x40000000000000) != 0)) &&
                        ((*(code *)*(RTCIntersectArguments **)(local_1158._0_8_ + 0x10))
                                   (&local_1138), *local_1138 == 0)))) goto LAB_00b6afb8;
                    *(undefined4 *)&(local_1120->intersector1).pointQuery = *local_1118;
                    *(undefined4 *)((long)&(local_1120->intersector1).pointQuery + 4) =
                         local_1118[1];
                    *(undefined4 *)&(local_1120->intersector1).name = local_1118[2];
                    *(undefined4 *)((long)&(local_1120->intersector1).name + 4) = local_1118[3];
                    *(undefined4 *)&(local_1120->intersector4).intersect = local_1118[4];
                    *(undefined4 *)((long)&(local_1120->intersector4).intersect + 4) = local_1118[5]
                    ;
                    *(undefined4 *)&(local_1120->intersector4).occluded = local_1118[6];
                    *(undefined4 *)((long)&(local_1120->intersector4).occluded + 4) = local_1118[7];
                    pRVar39 = (RayQueryContext *)0x0;
                    *(undefined4 *)&(local_1120->intersector4).name = local_1118[8];
                  }
                  else {
LAB_00b6afb8:
                    *(undefined4 *)&(This->intersector1).intersect = local_10d8._0_4_;
                  }
                  *(undefined4 *)(local_1198 + (long)context * 4) = 0;
                  uVar38 = *(undefined4 *)&(This->intersector1).intersect;
                  auVar55._4_4_ = uVar38;
                  auVar55._0_4_ = uVar38;
                  auVar55._8_4_ = uVar38;
                  auVar55._12_4_ = uVar38;
                  auVar56 = ZEXT1664(local_10c8);
                  auVar86 = vcmpps_avx(local_10c8,auVar55,2);
                  local_1198 = vandps_avx(auVar86,local_1198);
                  auVar4._0_8_ = (This->intersector1).intersect;
                  auVar4._8_8_ = (This->intersector1).occluded;
                  auVar73 = ZEXT1664(auVar4);
                  uVar37 = vextractps_avx(auVar4,1);
                  context = pRVar39;
                  lVar42 = local_1178;
                  uVar43 = local_1170;
                  lVar44 = local_1180;
                  pauVar45 = local_1168;
                }
                if ((((local_1198 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1198 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1198 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1198[0xf]) break;
                auVar72._8_4_ = 0x7f800000;
                auVar72._0_8_ = 0x7f8000007f800000;
                auVar72._12_4_ = 0x7f800000;
                auVar86 = vblendvps_avx(auVar72,auVar56._0_16_,local_1198);
                auVar74 = vshufps_avx(auVar86,auVar86,0xb1);
                auVar74 = vminps_avx(auVar74,auVar86);
                auVar95 = vshufpd_avx(auVar74,auVar74,1);
                auVar74 = vminps_avx(auVar95,auVar74);
                auVar74 = vcmpps_avx(auVar86,auVar74,0);
                auVar95 = local_1198 & auVar74;
                auVar86 = local_1198;
                if ((((auVar95 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar95 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar95[0xf] < '\0') {
                  auVar86 = vandps_avx(auVar74,local_1198);
                }
                uVar38 = vmovmskps_avx(auVar86);
                uVar36 = CONCAT44((int)((ulong)context >> 0x20),uVar38);
                context = (RayQueryContext *)0x0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                local_11d8._0_4_ = uVar37;
                lVar41 = local_11a8._0_8_;
              } while( true );
            }
          }
          auVar103 = ZEXT1664(local_f88);
          auVar106 = ZEXT1664(local_f98);
          auVar112 = ZEXT1664(local_fa8);
          auVar117 = ZEXT1664(local_fb8);
          auVar118 = ZEXT1664(local_fc8);
          auVar122 = ZEXT1664(local_fd8);
          auVar128 = ZEXT1664(local_fe8);
        }
        uVar38 = *(undefined4 *)&(This->intersector1).intersect;
        auVar56 = ZEXT1664(CONCAT412(uVar38,CONCAT48(uVar38,CONCAT44(uVar38,uVar38))));
        auVar73 = ZEXT464(*(uint *)&(This->intersector1).intersect);
      }
      goto LAB_00b6a5e1;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }